

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::node::send_single_refresh(node *this,endpoint *ep,int bucket,node_id *id)

{
  uint *__return_storage_ptr__;
  digest32<160L> *__return_storage_ptr___00;
  bool bVar1;
  entry *peVar2;
  element_type *peVar3;
  shared_ptr<libtorrent::dht::observer> local_188;
  bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void> local_171;
  string_view local_170;
  string_view local_160;
  string local_150;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  undefined1 local_100 [8];
  entry e;
  undefined1 local_c8 [8];
  shared_ptr<libtorrent::dht::ping_observer> o;
  undefined1 local_a0 [8];
  shared_ptr<libtorrent::dht::traversal_algorithm> algo;
  digest32<160L> local_78;
  digest32<160L> local_64;
  undefined1 local_50 [8];
  node_id target;
  node_id mask;
  node_id *id_local;
  int bucket_local;
  endpoint *ep_local;
  node *this_local;
  
  __return_storage_ptr__ = target.m_number._M_elems + 3;
  generate_prefix_mask((node_id *)__return_storage_ptr__,bucket + 1);
  generate_secret_id();
  digest32<160L>::operator~(&local_78,(digest32<160L> *)__return_storage_ptr__);
  digest32<160L>::operator&((digest32<160L> *)local_50,&local_64,&local_78);
  __return_storage_ptr___00 =
       (digest32<160L> *)
       ((long)&algo.
               super___shared_ptr<libtorrent::dht::traversal_algorithm,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi + 4);
  digest32<160L>::operator&
            (__return_storage_ptr___00,&this->m_id,(digest32<160L> *)__return_storage_ptr__);
  digest32<160L>::operator|=((digest32<160L> *)local_50,__return_storage_ptr___00);
  digest32<160L>::digest32
            ((digest32<160L> *)
             ((long)&o.
                     super___shared_ptr<libtorrent::dht::ping_observer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  ::std::
  make_shared<libtorrent::dht::traversal_algorithm,libtorrent::dht::node&,libtorrent::digest32<160l>>
            ((node *)local_a0,(digest32<160L> *)this);
  rpc_manager::
  allocate_observer<libtorrent::dht::ping_observer,std::shared_ptr<libtorrent::dht::traversal_algorithm>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
            ((rpc_manager *)local_c8,
             (shared_ptr<libtorrent::dht::traversal_algorithm> *)&this->m_rpc,
             (basic_endpoint<boost::asio::ip::udp> *)local_a0,(digest32<160L> *)ep);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_c8);
  if (bVar1) {
    entry::entry((entry *)local_100);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"y");
    peVar2 = entry::operator[]((entry *)local_100,local_110);
    entry::operator=(peVar2,"q");
    bVar1 = routing_table::is_full(&this->m_table,bucket);
    if (bVar1) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_120,"q");
      peVar2 = entry::operator[]((entry *)local_100,local_120);
      entry::operator=(peVar2,"ping");
      counters::inc_stats_counter(this->m_counters,0x90,1);
    }
    else {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"q");
      peVar2 = entry::operator[]((entry *)local_100,local_130);
      entry::operator=(peVar2,"get_peers");
      digest32<160l>::to_string_abi_cxx11_(&local_150,local_50);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"a");
      peVar2 = entry::operator[]((entry *)local_100,local_160);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_170,"info_hash");
      peVar2 = entry::operator[](peVar2,local_170);
      entry::operator=(peVar2,&local_150);
      ::std::__cxx11::string::~string((string *)&local_150);
      counters::inc_stats_counter(this->m_counters,0x94,1);
    }
    local_171.m_val = '\x01';
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::dht::ping_observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::ping_observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
    operator|=(&(peVar3->super_observer).flags,local_171);
    ::std::shared_ptr<libtorrent::dht::observer>::shared_ptr<libtorrent::dht::ping_observer,void>
              (&local_188,(shared_ptr<libtorrent::dht::ping_observer> *)local_c8);
    rpc_manager::invoke(&this->m_rpc,(entry *)local_100,ep,&local_188);
    ::std::shared_ptr<libtorrent::dht::observer>::~shared_ptr(&local_188);
    entry::~entry((entry *)local_100);
    e.super_variant_type.
    super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    ._M_index = '\0';
    e.super_variant_type.
    super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    ._33_3_ = 0;
  }
  else {
    e.super_variant_type.
    super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    ._M_index = '\x01';
    e.super_variant_type.
    super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    .
    super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
    ._33_3_ = 0;
  }
  ::std::shared_ptr<libtorrent::dht::ping_observer>::~shared_ptr
            ((shared_ptr<libtorrent::dht::ping_observer> *)local_c8);
  ::std::shared_ptr<libtorrent::dht::traversal_algorithm>::~shared_ptr
            ((shared_ptr<libtorrent::dht::traversal_algorithm> *)local_a0);
  return;
}

Assistant:

void node::send_single_refresh(udp::endpoint const& ep, int const bucket
	, node_id const& id)
{
	TORRENT_ASSERT(id != m_id);
	TORRENT_ASSERT(bucket >= 0);
	TORRENT_ASSERT(bucket <= 159);

	// generate a random node_id within the given bucket
	// TODO: 2 it would be nice to have a bias towards node-id prefixes that
	// are missing in the bucket
	node_id mask = generate_prefix_mask(bucket + 1);
	node_id target = generate_secret_id() & ~mask;
	target |= m_id & mask;

	// create a dummy traversal_algorithm
	auto algo = std::make_shared<traversal_algorithm>(*this, node_id());
	auto o = m_rpc.allocate_observer<ping_observer>(std::move(algo), ep, id);
	if (!o) return;
#if TORRENT_USE_ASSERTS
	o->m_in_constructor = false;
#endif
	entry e;
	e["y"] = "q";

	if (m_table.is_full(bucket))
	{
		// current bucket is full, just ping it.
		e["q"] = "ping";
		m_counters.inc_stats_counter(counters::dht_ping_out);
	}
	else
	{
		// use get_peers instead of find_node. We'll get nodes in the response
		// either way.
		e["q"] = "get_peers";
		e["a"]["info_hash"] = target.to_string();
		m_counters.inc_stats_counter(counters::dht_get_peers_out);
	}

	o->flags |= observer::flag_queried;
	m_rpc.invoke(e, ep, o);
}